

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounddef.cpp
# Opt level: O3

void sdInit(void)

{
  uchar *__dest;
  int iVar1;
  long *plVar2;
  size_t __n;
  int *piVar3;
  int *__s;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  char (*__dest_00) [32];
  long lVar8;
  char s [256];
  char local_138 [264];
  
  plVar2 = (long *)operator_new__(0x1b2d7);
  __dest_00 = patchnames;
  lVar7 = 0;
  uVar4 = 0;
  soundmem = (uchar *)plVar2;
  patchoffsets = plVar2;
  do {
    __dest = (uchar *)((long)plVar2 + lVar7 + 0x200);
    patchoffsets[uVar4] = (long)__dest - (long)soundmem;
    sprintf(local_138,"Init Patch #%03d",uVar4 & 0xffffffff);
    strcpy(*__dest_00,local_138);
    memcpy(__dest,"@@\x01",0x357);
    uVar4 = uVar4 + 1;
    lVar7 = lVar7 + 0x357;
    __dest_00 = __dest_00 + 1;
  } while (lVar7 != 0x1ab80);
  editmem = (uchar *)(plVar2 + 0x35b0);
  memcpy(editmem,"@@\x01",0x357);
  globals[0x10] = '\x02';
  globals[0x11] = 'Z';
  globals[0x12] = ' ';
  globals[0x13] = '\x14';
  globals[0x14] = '@';
  globals[0x15] = '@';
  globals[0x16] = '\0';
  builtin_strncpy(globals,"@@ \x7fdP@@",9);
  globals[9] = '\0';
  globals[10] = '@';
  globals[0xb] = '\0';
  globals[0xc] = '\x7f';
  globals[0xd] = '\0';
  globals[0xe] = '\0';
  globals[0xf] = '\x01';
  memcpy(v2clipboard,"@@\x01",0x357);
  builtin_strncpy(v2clipname,"Init Patch",0xb);
  v2version = 0;
  lVar7 = 0;
  iVar5 = 0;
  do {
    iVar1 = *(int *)((long)&v2parms[0].version + lVar7);
    if (iVar5 < iVar1) {
      iVar5 = iVar1;
      v2version = iVar1;
    }
    lVar7 = lVar7 + 0x30;
  } while (lVar7 != 0x10b0);
  lVar7 = 0;
  do {
    iVar1 = *(int *)((long)&v2gparms[0].version + lVar7);
    if (iVar5 < iVar1) {
      iVar5 = iVar1;
      v2version = iVar1;
    }
    lVar7 = lVar7 + 0x30;
  } while (lVar7 != 0x450);
  __n = (long)(int)(iVar5 + 1U) << 2;
  uVar4 = 0xffffffffffffffff;
  if (-2 < iVar5) {
    uVar4 = __n;
  }
  piVar3 = (int *)operator_new__(uVar4);
  v2vsizes = piVar3;
  __s = (int *)operator_new__(uVar4);
  lVar7 = 0;
  v2gsizes = __s;
  memset(piVar3,0,__n);
  memset(__s,0,__n);
  do {
    iVar1 = v2parms[lVar7].version;
    lVar6 = (long)iVar5 + 1;
    if (iVar1 <= iVar5) {
      do {
        piVar3[lVar6 + -1] = piVar3[lVar6 + -1] + 1;
        lVar6 = lVar6 + -1;
      } while (iVar1 < lVar6);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x59);
  lVar7 = 0;
  do {
    iVar1 = v2gparms[lVar7].version;
    lVar6 = (long)iVar5 + 1;
    if (iVar1 <= iVar5) {
      do {
        __s[lVar6 + -1] = __s[lVar6 + -1] + 1;
        lVar6 = lVar6 + -1;
      } while (iVar1 < lVar6);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x17);
  if (-1 < iVar5) {
    uVar4 = 0;
    do {
      piVar3[uVar4] = piVar3[uVar4] + 0x2fe;
      uVar4 = uVar4 + 1;
    } while (iVar5 + 1U != uVar4);
  }
  piVar3 = (int *)operator_new__(0x44);
  lVar7 = 0;
  iVar5 = 0;
  v2topics2 = piVar3;
  do {
    *piVar3 = iVar5;
    iVar5 = iVar5 + *(int *)((long)&v2topics[0].no + lVar7);
    lVar7 = lVar7 + 0x18;
    piVar3 = piVar3 + 1;
  } while (lVar7 != 0x198);
  piVar3 = (int *)operator_new__(0x14);
  lVar7 = 0;
  iVar5 = 0;
  v2gtopics2 = piVar3;
  do {
    *piVar3 = iVar5;
    iVar5 = iVar5 + *(int *)((long)&v2gtopics[0].no + lVar7);
    lVar7 = lVar7 + 0x18;
    piVar3 = piVar3 + 1;
  } while (lVar7 != 0x78);
  lVar7 = 0;
  memset(speech[0] + 0x40,0,0x3fc0);
  lVar6 = 0;
  lVar8 = 1;
  do {
    speechptrs[lVar7] = speech[lVar6];
    speechptrs[lVar7 + 1] = speech[lVar8];
    lVar7 = lVar7 + 2;
    lVar6 = lVar6 + 2;
    lVar8 = lVar8 + 2;
  } while (lVar7 != 0x40);
  memcpy(speech,"!DHAX_ !kwIH_k !br4AH_UHn !fAA_ks !jAH_mps !OW!vER_ !DHAX_ !lEY!zIY_ !dAA_g ",0x4d)
  ;
  return;
}

Assistant:

void sdInit()
{
    soundmem = new unsigned char [smsize + v2soundsize];
    patchoffsets = (long *)soundmem;
    unsigned char *sptr = soundmem + 128*4;

    // printf("sound size: %d\n",v2nparms);
    char s[256];

    for (int i = 0; i < 129; i++)
    {
        if (i < 128)
        {
            patchoffsets[i] = (long)(sptr - soundmem);
            sprintf(s, "Init Patch #%03d", i);
            strcpy(patchnames[i], s);
        } else
            editmem = sptr;
        memcpy(sptr, v2initsnd, v2soundsize);
        sptr += v2soundsize;
    }
    for (int i = 0; i < v2ngparms; i++)
        globals[i] = v2initglobs[i];

    memcpy(v2clipboard, v2initsnd, v2soundsize);
    sprintf(v2clipname, "Init Patch");

    // init version control
    v2version = 0;
    for (int i = 0; i < v2nparms; i++)
        if (v2parms[i].version > v2version)
            v2version = v2parms[i].version;
    for (int i = 0; i < v2ngparms; i++)
        if (v2gparms[i].version > v2version)
            v2version = v2gparms[i].version;

    v2vsizes = new int[v2version + 1];
    v2gsizes = new int[v2version + 1];
    memset(v2vsizes, 0, (v2version + 1)*sizeof(int));
    memset(v2gsizes, 0, (v2version + 1)*sizeof(int));
    for (int i = 0; i < v2nparms; i++)
    {
        const V2PARAM &p = v2parms[i];
//        ATLASSERT(p.version<=v2version);
        for (int j = v2version; j >= p.version; j--)
            v2vsizes[j]++;
    }
    for (int i = 0; i < v2ngparms; i++)
    {
        const V2PARAM &p = v2gparms[i];
        //ATLASSERT(p.version<=v2version);
        for (int j = v2version; j >= p.version; j--)
            v2gsizes[j]++;
    }
//ATLASSERT(v2vsizes[v2version]==v2nparms);

    for (int i = 0; i <= v2version; i++)
    {
        // printf("size of version %d sound bank: %d params, %d globals\n",i,v2vsizes[i],v2gsizes[i]);
        v2vsizes[i] += 1 + 255*3;
    }

    v2topics2 = new int[v2ntopics];
    int p = 0;
    for (int i = 0; i < v2ntopics; i++)
    {
        v2topics2[i] = p;
        p += v2topics[i].no;
    }

    v2gtopics2 = new int[v2ngtopics];
    p = 0;
    for (int i = 0; i < v2ngtopics; i++)
    {
        v2gtopics2[i] = p;
        p += v2gtopics[i].no;
    }

#ifdef RONAN
    memset(speech, 0, 64*256);
    for (int i = 0; i < 64; i++)
        speechptrs[i] = speech[i];

    strcpy(speech[0], "!DHAX_ !kwIH_k !br4AH_UHn !fAA_ks !jAH_mps !OW!vER_ !DHAX_ !lEY!zIY_ !dAA_g ");
#endif
}